

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall CLI::InvalidError::InvalidError(InvalidError *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::operator+(&local_30,name,": Too many positional arguments with unlimited expected args");
  InvalidError(this,&local_30,InvalidError);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

InvalidError(std::string name)
        : InvalidError(name + ": Too many positional arguments with unlimited expected args", ExitCodes::InvalidError) {
    }